

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gameboard.cpp
# Opt level: O1

void __thiscall GameBoard::handleButtonClick(GameBoard *this,int i,int j)

{
  Turn TVar1;
  Field *pFVar2;
  bool bVar3;
  reference this_00;
  reference ppFVar4;
  QByteArrayView QVar5;
  QByteArrayView QVar6;
  QArrayData *local_58;
  QArrayData *local_38 [2];
  long local_28;
  
  this_00 = QList<QList<Field_*>_>::operator[](&this->grid_,(long)i);
  ppFVar4 = QList<Field_*>::operator[](this_00,(long)j);
  pFVar2 = *ppFVar4;
  QAbstractButton::text();
  if (local_38[0] != (QArrayData *)0x0) {
    LOCK();
    (local_38[0]->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_38[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_38[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_38[0],2,8);
    }
  }
  if (local_28 != 0) {
    return;
  }
  if (this->turn_ == Player2) {
    QVar6.m_data = (storage_type *)0x1;
    QVar6.m_size = (qsizetype)local_38;
    QString::fromUtf8(QVar6);
    local_58 = local_38[0];
    QAbstractButton::setText((QString *)pFVar2);
  }
  else {
    if (this->turn_ != Player1) goto LAB_00108a20;
    QVar5.m_data = (storage_type *)0x1;
    QVar5.m_size = (qsizetype)local_38;
    QString::fromUtf8(QVar5);
    local_58 = local_38[0];
    QAbstractButton::setText((QString *)pFVar2);
  }
  if (local_58 != (QArrayData *)0x0) {
    LOCK();
    (local_58->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_58->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_58->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_58,2,8);
    }
  }
LAB_00108a20:
  bVar3 = winConditionSatisfied(this);
  if (bVar3) {
    gameOver(this,2 - (uint)(this->turn_ == Player1));
    beginNewGame(this);
  }
  TVar1 = this->turn_;
  this->turn_ = (TVar1 - ((TVar1 - ((int)(TVar1 + Player2) >> 0x1f)) + 1 & 0xfffffffe)) + Player2;
  return;
}

Assistant:

void GameBoard::handleButtonClick(int i, int j)
{
    Field* field = grid_[i][j];
    if(field->text().length() != 0) //There is already an X or an O
        return;

    if(turn_ == Turn::Player1)
        field->setText("X");
    else if(turn_ == Turn::Player2)
        field->setText("O");

    if(winConditionSatisfied())
    {
       if(turn_ == Turn::Player1)
           emit gameOver(1);
       else
           emit gameOver(2);
       beginNewGame();
    }

    turn_ = static_cast<Turn>((static_cast<int>(turn_) + 1) % 2);

}